

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_signals.cpp
# Opt level: O0

int main(void)

{
  undefined1 *this;
  bool bVar1;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  int in_ESI;
  atomic<int> *value;
  connection cVar2;
  int local_10c;
  reference local_108;
  thread *thread;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  thread local_e0;
  int local_d4;
  undefined1 auStack_d0 [4];
  int i_1;
  slot_base *local_c8;
  anon_class_8_1_bc7188dc local_c0;
  int local_b4;
  atomic<int> local_b0;
  int i;
  atomic<int> counter;
  undefined1 local_a0 [8];
  signal<void_()> sig;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&sig.m_slots.field_0x68);
  obs::signal<void_()>::signal((signal<void_()> *)local_a0,in_ESI,__handler);
  memset(&local_b0,0,4);
  cVar2.m_slot = local_c8;
  cVar2.m_signal = _auStack_d0;
  for (local_b4 = 0; _auStack_d0 = cVar2, local_b4 < 100; local_b4 = local_b4 + 1) {
    local_c0.counter = &local_b0;
    cVar2 = obs::signal<void()>::connect<main::__0>((signal<void()> *)local_a0,&local_c0);
  }
  for (local_d4 = 0; local_d4 < 100; local_d4 = local_d4 + 1) {
    __range1 = (vector<std::thread,_std::allocator<std::thread>_> *)local_a0;
    std::thread::thread<main::__1,,void>(&local_e0,(type *)&__range1);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              ((vector<std::thread,_std::allocator<std::thread>_> *)&sig.m_slots.field_0x68,
               &local_e0);
    std::thread::~thread(&local_e0);
  }
  this = &sig.m_slots.field_0x68;
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)this);
  thread = (thread *)
           std::vector<std::thread,_std::allocator<std::thread>_>::end
                     ((vector<std::thread,_std::allocator<std::thread>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)&thread);
    if (!bVar1) break;
    local_108 = __gnu_cxx::
                __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                ::operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  local_10c = 1000000;
  value = &local_b0;
  expect_eq<int,std::atomic<int>>
            (&local_10c,value,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/count_signals.cpp"
             ,0x24);
  obs::signal<void_()>::~signal((signal<void_()> *)local_a0,(int)value,__handler_00);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&sig.m_slots.field_0x68);
  return 0;
}

Assistant:

int main() {
  std::vector<std::thread> threads;
  obs::signal<void()> sig;

  // We need and atomic operator++()
  std::atomic<int> counter(0);

  for (int i=0; i<100; ++i) {
    sig.connect([&](){ ++counter; });
  }

  for (int i=0; i<100; ++i) {
    threads.push_back(
      std::thread(
        [&](){
          for (int i=0; i<100; ++i)
            sig();
        }));
  }

  for (auto& thread : threads)
    thread.join();

  EXPECT_EQ(100*100*100, counter);
}